

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O3

void xemmai::t_fiber::f_run<xemmai::t_debug_context>(void)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong *puVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  wchar_t *pwVar9;
  long in_FS_OFFSET;
  wstring_view a_message;
  undefined1 auVar10 [16];
  t_debug_context context;
  undefined8 local_58;
  ulong *local_50;
  undefined8 local_48;
  undefined8 local_30;
  
  pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc60));
  puVar2 = *(undefined8 **)(in_FS_OFFSET + -0x30);
  puVar1 = puVar2 + -2;
  uVar3 = puVar2[-2];
  uVar4 = puVar2[-1];
  *(ulong **)(in_FS_OFFSET + -0x30) = puVar1;
  puVar5 = *(ulong **)(*(long *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc90) + 0x10);
  local_58 = 0;
  local_48 = 0;
  local_30 = 0;
  puVar5[7] = (ulong)&local_58;
  pwVar9 = (wchar_t *)(puVar2 + 4);
  *(wchar_t **)(in_FS_OFFSET + -0x30) = pwVar9;
  puVar2[2] = uVar3;
  puVar2[3] = uVar4;
  *puVar2 = 0;
  uVar6 = *puVar5;
  local_50 = puVar1;
  if (4 < uVar6) {
    auVar10 = (**(code **)(*(long *)(uVar6 + 0x40) + 0xb8))(uVar6,puVar1,1);
    while( true ) {
      pwVar9 = auVar10._8_8_;
      if (auVar10._0_8_ == -1) {
        uVar3 = puVar2[-2];
        uVar4 = puVar2[-1];
        *(ulong **)(in_FS_OFFSET + -0x30) = puVar1;
        if (*(long *)(in_FS_OFFSET + -0x30) != *(long *)(puVar5[3] + 0x18)) {
          __assert_fail("f_stack() == q->v_internal->v_estack.get()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/fiber.cc"
                        ,0xa9,
                        "static void xemmai::t_fiber::f_run() [T_context = xemmai::t_debug_context]"
                       );
        }
        lVar7 = *(long *)(in_FS_OFFSET + -0x28);
        *(undefined8 *)(*(long *)(*(long *)(lVar7 + 0xc90) + 0x10) + 0x38) = local_30;
        iVar8 = pthread_mutex_lock((pthread_mutex_t *)(lVar7 + 0xc60));
        if (iVar8 == 0) {
          *(undefined8 *)(puVar5[3] + 8) = 0;
          puVar5[3] = 0;
          lVar7 = *(long *)(*(long *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc58) + 8);
          *(undefined1 *)(lVar7 + 0x70) = 0;
          puVar2 = *(undefined8 **)(lVar7 + 0x78);
          *puVar2 = uVar3;
          puVar2[1] = uVar4;
          lVar7 = *(long *)(lVar7 + 0x60);
          *(long *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc90) = lVar7;
          *(undefined8 *)(in_FS_OFFSET + -0x30) = *(undefined8 *)(lVar7 + 0x20);
          setcontext(lVar7 + 0x78);
          return;
        }
        std::__throw_system_error(iVar8);
      }
      uVar6 = *puVar1;
      if (uVar6 < 5) break;
      auVar10 = (**(code **)(*(long *)(uVar6 + 0x40) + 0xb8))(uVar6,puVar1,auVar10._0_8_);
    }
  }
  a_message._M_str = pwVar9;
  a_message._M_len = (size_t)L"not supported.";
  f_throw((xemmai *)0xe,a_message);
}

Assistant:

void t_fiber::f_run()
{
	t_thread::v_current->v_mutex.unlock();
	auto used = f_stack() - 1;
	auto x = *used;
	f_stack__(used);
	auto q = t_thread::v_current->v_active->v_fiber;
	auto b = false;
	{
		T_context context;
		try {
			x = q->v_callable(x);
		} catch (const t_rvalue& thrown) {
			q->f_caught(thrown, nullptr);
			b = true;
			x = thrown;
		} catch (...) {
			b = true;
			x = t_throwable::f_instantiate(L"<unexpected>."sv);
		}
		assert(f_stack() == q->v_internal->v_estack.get());
	}
	t_thread::v_current->v_mutex.lock();
	q->v_internal->v_thread = nullptr;
	q->v_internal = nullptr;
	auto& p = t_thread::v_current->v_thread->v_fiber->f_as<t_fiber>();
	p.v_throw = b;
	*p.v_return = x;
	t_thread::v_current->v_active = p.v_internal;
#ifdef __unix__
	f_stack__(p.v_internal->v_estack_used);
	setcontext(&p.v_internal->v_context);
#endif
#ifdef _WIN32
	v_current = p.v_internal;
	SwitchToFiber(p.v_internal->v_handle);
#endif
}